

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O0

void __thiscall
ElementsConfidentialAddress_P2shWrappedP2wshAddress_Test::
~ElementsConfidentialAddress_P2shWrappedP2wshAddress_Test
          (ElementsConfidentialAddress_P2shWrappedP2wshAddress_Test *this)

{
  ElementsConfidentialAddress_P2shWrappedP2wshAddress_Test *this_local;
  
  ~ElementsConfidentialAddress_P2shWrappedP2wshAddress_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2shWrappedP2wshAddress) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  ByteData160 pubkey_hash = HashUtil::Hash160(pubkey);
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_DUP);
  builder.AppendOperator(ScriptOperator::OP_HASH160);
  builder.AppendData(pubkey_hash);
  builder.AppendOperator(ScriptOperator::OP_EQUALVERIFY);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  const Script &redeem_script = builder.Build();
  // locking_script = ScriptUtil::CreateP2wshLockingScript(pubkey);
  ByteData256 script_hash = HashUtil::Sha256(redeem_script);
  builder = ScriptBuilder();
  builder.AppendOperator(ScriptOperator::OP_0);
  builder.AppendData(script_hash);
  const Script &script = builder.Build();
  ConfidentialKey key = ConfidentialKey(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16");
  ElementsConfidentialAddress address;
  Address unblind_addr;

  unblind_addr = Address(ElementsNetType::kLiquidV1, script, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnZNmgEuyWyLvABqzeNyjtqWNNx3NTXMxXp",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("258b7b985398033523194e96d9509bc04d011645",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("Gkc3VmVBsUoojntzW5zBvoETXm1zv6Bibz",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kLiquidV1, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());

  unblind_addr = Address(ElementsNetType::kElementsRegtest, script, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBauT4GvoJ5ZyZJP6p8rKYLor6JAdFoaoYJ",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("258b7b985398033523194e96d9509bc04d011645",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("XEmkwgDZRyVMBPv7PByfPK2nBvHxWJXpBQ",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());
}